

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O2

void Dss_ManCacheAlloc(Dss_Man_t *p)

{
  int iVar1;
  Dss_Ent_t **ppDVar2;
  
  if (p->nCache == 0) {
    iVar1 = Abc_PrimeCudd(100000);
    p->nCache = iVar1;
    ppDVar2 = (Dss_Ent_t **)calloc((long)iVar1,8);
    p->pCache = ppDVar2;
    return;
  }
  __assert_fail("p->nCache == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                ,0x37c,"void Dss_ManCacheAlloc(Dss_Man_t *)");
}

Assistant:

void Dss_ManCacheAlloc( Dss_Man_t * p )
{
    assert( p->nCache == 0 );
    p->nCache = Abc_PrimeCudd( 100000 );
    p->pCache = ABC_CALLOC( Dss_Ent_t *, p->nCache );
}